

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  size_t sVar5;
  char cVar6;
  result rVar7;
  round_direction rVar8;
  ulong uVar9;
  decimal_fp<float> dVar10;
  format_error *this;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  size_t count;
  int iVar14;
  long *plVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t divisor;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint64_t error;
  ulong uVar21;
  bool bVar22;
  fp fVar23;
  fp fVar24;
  decimal_fp<double> dVar25;
  ulong uStackY_a0;
  undefined4 in_stack_ffffffffffffff68;
  gen_digits_handler handler;
  int cached_exp10;
  double local_58;
  ulong local_50;
  ulong local_48;
  fp local_40;
  
  uVar16 = (ulong)specs & 0xff00000000;
  bVar22 = uVar16 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && uVar16 == 0x200000000) {
      buffer<char>::try_resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  local_50 = (ulong)specs >> 0x20;
  if ((specs._4_4_ >> 0x13 & 1) != 0) {
    iVar18 = snprintf_float<double>(value,precision,specs,buf);
    return iVar18;
  }
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar25 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar25.significand);
      return dVar25.exponent;
    }
    dVar10 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar10.significand);
    return dVar10.exponent;
  }
  cached_exp10 = 0;
  local_58 = value;
  fp::assign<double,_0>(&local_40,value);
  fVar23.f = (ulong)(uint)local_40.e;
  fVar23._8_8_ = extraout_RDX;
  fVar23 = normalize<0>((detail *)local_40.f,fVar23);
  fVar24 = get_cached_power(-0x7c - fVar23.e,&cached_exp10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = fVar24.f;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = fVar23.f;
  uVar21 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  cVar6 = (char)fVar24.e + (char)fVar23.e;
  bVar11 = -cVar6 - 0x40;
  pbVar1 = (byte *)buf->ptr_;
  handler.size = 0;
  bVar12 = -cVar6;
  divisor = 1L << (bVar12 & 0x3f);
  uVar17 = uVar21 >> (bVar12 & 0x3f);
  uVar13 = (uint)uVar17 | 1;
  uVar19 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> uVar19 == 0; uVar19 = uVar19 - 1) {
    }
  }
  uVar9 = (uVar17 & 0xffffffff) +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar19 * 8);
  iVar18 = -cached_exp10;
  uVar20 = uVar9 >> 0x20;
  uVar19 = (uint)(uVar9 >> 0x20);
  handler.precision = precision;
  handler.buf = (char *)pbVar1;
  handler.exp10 = iVar18;
  handler.fixed = bVar22;
  if (uVar16 == 0x200000000) {
    uVar13 = uVar19 - cached_exp10;
    if ((uVar13 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar13) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    handler.precision = uVar13 + precision;
    if (handler.precision != 0 && SCARRY4(uVar13,precision) == handler.precision < 0)
    goto LAB_0012fc3f;
    if (handler.precision < 0) goto LAB_0012fe60;
    iVar14 = 0;
    rVar8 = get_round_direction(*(long *)(basic_impl_data<void>::power_of_10_64 +
                                         ((long)(uVar9 - 0x100000000) >> 0x20) * 8) <<
                                (bVar11 & 0x3f),uVar21 / 10,10);
    if (rVar8 != unknown) {
      handler.size = 1;
      *pbVar1 = rVar8 == up | 0x30;
      goto LAB_0012fe60;
    }
  }
  else {
LAB_0012fc3f:
    local_48 = divisor - 1;
    uVar21 = uVar21 & local_48;
    plVar15 = (long *)(basic_impl_data<void>::power_of_10_64 + (long)(int)(uVar19 - 1) * 8);
    error = 1;
    do {
      iVar18 = (int)uVar20;
      uVar19 = iVar18 - 1;
      uVar20 = (ulong)uVar19;
      switch(uVar20) {
      case 0:
        cVar6 = (char)uVar17;
        uVar17 = 0;
        goto LAB_0012fcea;
      case 1:
        uStackY_a0 = 10;
        break;
      case 2:
        uStackY_a0 = 100;
        break;
      case 3:
        uStackY_a0 = 1000;
        break;
      case 4:
        uStackY_a0 = 10000;
        break;
      case 5:
        uStackY_a0 = 100000;
        break;
      case 6:
        uStackY_a0 = 1000000;
        break;
      case 7:
        uStackY_a0 = 10000000;
        break;
      case 8:
        uStackY_a0 = 100000000;
        break;
      case 9:
        uStackY_a0 = 1000000000;
        break;
      default:
        cVar6 = '\0';
        goto LAB_0012fcea;
      }
      cVar6 = (char)((uVar17 & 0xffffffff) / uStackY_a0);
      uVar17 = (uVar17 & 0xffffffff) % uStackY_a0;
LAB_0012fcea:
      rVar7 = gen_digits_handler::on_digit
                        (&handler,cVar6 + '0',*plVar15 << (bVar11 & 0x3f),
                         ((uVar17 & 0xffffffff) << (bVar11 & 0x3f)) + uVar21,1,true);
      if (rVar7 != more) goto LAB_0012fe10;
      plVar15 = plVar15 + -1;
    } while (1 < iVar18);
    do {
      uVar17 = uVar21 * 10;
      error = error * 10;
      uVar21 = uVar17 & local_48;
      uVar19 = (int)uVar20 - 1;
      uVar20 = (ulong)uVar19;
      rVar7 = gen_digits_handler::on_digit
                        (&handler,(char)(uVar17 >> (bVar11 & 0x3f)) + '0',divisor,uVar21,error,false
                        );
    } while (rVar7 == more);
LAB_0012fe10:
    iVar14 = handler.size;
    iVar18 = handler.exp10;
    if (rVar7 != error) {
LAB_0012fe60:
      iVar18 = uVar19 + iVar18;
      buffer<char>::try_resize(buf,(ulong)(uint)handler.size);
      uVar19 = (uint)local_50;
      goto LAB_0012fecb;
    }
  }
  iVar4 = handler.precision;
  iVar18 = ~cached_exp10 + uVar19 + iVar14;
  handler.buf = (char *)0x0;
  handler.size = 0;
  uVar19 = (uint)local_50;
  if ((uVar19 >> 0x12 & 1) == 0) {
    bVar22 = fp::assign<double,_0>((fp *)&handler,local_58);
  }
  else {
    bVar22 = fp::assign<float,_0>((fp *)&handler,(float)local_58);
  }
  iVar14 = 0x2ff;
  if (iVar4 < 0x2ff) {
    iVar14 = iVar4;
  }
  fVar24.f = (ulong)(uint)handler.size;
  fVar24.e._0_1_ = bVar22;
  fVar24._9_7_ = 0;
  format_dragon((detail *)handler.buf,fVar24,SUB41(iVar14,0),(int)buf,
                (buffer<char> *)&stack0xffffffffffffff6c,
                (int *)CONCAT44(iVar18,in_stack_ffffffffffffff68));
LAB_0012fecb:
  if ((uVar19 >> 0x14 & 1) == 0 && uVar16 != 0x200000000) {
    sVar5 = buf->size_;
    iVar14 = iVar18;
    do {
      iVar18 = iVar14;
      count = sVar5;
      if (count == 0) break;
      sVar5 = count - 1;
      iVar14 = iVar18 + 1;
    } while (buf->ptr_[count - 1] == '0');
    buffer<char>::try_resize(buf,count);
  }
  return iVar18;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}